

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::BuildsystemFileScope::~BuildsystemFileScope(BuildsystemFileScope *this)

{
  cmGlobalGenerator *pcVar1;
  cmake *pcVar2;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar3;
  
  PopFunctionBlockerBarrier(this->Makefile,this->ReportError);
  PopSnapshot(this->Makefile,this->ReportError);
  cmFileLockPool::PopFileScope(&this->GG->FileLockPool);
  pcVar1 = this->GG;
  pcVar1->CurrentConfigureMakefile = this->CurrentMakefile;
  pcVar2 = pcVar1->CMakeInstance;
  (pcVar2->CurrentSnapshot).Position.Position = (this->Snapshot).Position.Position;
  pcVar3 = (this->Snapshot).Position.Tree;
  (pcVar2->CurrentSnapshot).State = (this->Snapshot).State;
  (pcVar2->CurrentSnapshot).Position.Tree = pcVar3;
  return;
}

Assistant:

~BuildsystemFileScope()
  {
    this->Makefile->PopFunctionBlockerBarrier(this->ReportError);
    this->Makefile->PopSnapshot(this->ReportError);
#if !defined(CMAKE_BOOTSTRAP)
    this->GG->GetFileLockPool().PopFileScope();
#endif
    this->GG->SetCurrentMakefile(this->CurrentMakefile);
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
  }